

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptFunction * __thiscall
Js::JavascriptLibrary::EnsureArrayPrototypeKeysFunction(JavascriptLibrary *this)

{
  bool bVar1;
  JavascriptFunction **ppJVar2;
  ScriptContext *this_00;
  RuntimeFunction *ptr;
  ScriptContext **ppSVar3;
  JavascriptLibrary *this_local;
  
  ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)
                       &(this->super_JavascriptLibraryBase).arrayPrototypeKeysFunction);
  if (*ppJVar2 == (JavascriptFunction *)0x0) {
    this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                        (&(this->super_JavascriptLibraryBase).scriptContext);
    bVar1 = ScriptContext::IsJsBuiltInEnabled(this_00);
    if (bVar1) {
      ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                          ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
      EnsureBuiltInEngineIsReady(Array_prototype,*ppSVar3);
    }
    else {
      ptr = DefaultCreateFunction
                      (this,(FunctionInfo *)Js::JavascriptArray::EntryInfo::Keys,0,
                       (DynamicObject *)0x0,(DynamicType *)0x0,0xcf);
      Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
                (&(this->super_JavascriptLibraryBase).arrayPrototypeKeysFunction,
                 &ptr->super_JavascriptFunction);
    }
  }
  ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)
                       &(this->super_JavascriptLibraryBase).arrayPrototypeKeysFunction);
  return *ppJVar2;
}

Assistant:

JavascriptFunction* JavascriptLibrary::EnsureArrayPrototypeKeysFunction()
    {
        if (arrayPrototypeKeysFunction == nullptr)
        {
#ifndef ENABLE_JS_BUILTINS
            arrayPrototypeKeysFunction = DefaultCreateFunction(&JavascriptArray::EntryInfo::Keys, 0, nullptr, nullptr, PropertyIds::keys);
#else
            if (!scriptContext->IsJsBuiltInEnabled())
            {
                arrayPrototypeKeysFunction = DefaultCreateFunction(&JavascriptArray::EntryInfo::Keys, 0, nullptr, nullptr, PropertyIds::keys);
            }
            else
            {
                EnsureBuiltInEngineIsReady(JsBuiltInFile::Array_prototype, scriptContext);
            }
#endif
        }
        return arrayPrototypeKeysFunction;
    }